

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall
wasm::TranslateToFuzzReader::fixAfterChanges(wasm::Function*)::Fixer::visitExpression(wasm::
Expression__(void *this,Expression *curr)

{
  Id IVar1;
  int iVar2;
  uintptr_t uVar3;
  int *piVar4;
  bool bVar5;
  bool bVar6;
  const_iterator cVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  Rethrow *cast;
  
  IVar1 = curr->_id;
  if ((int)IVar1 < 3) {
    if (IVar1 == BlockId) goto LAB_001367bf;
    if (IVar1 == InvalidId) goto LAB_00136d95;
  }
  else if ((IVar1 == LoopId) || (IVar1 == TryId)) {
LAB_001367bf:
    if (curr[1].type.id != 0) {
      cVar7 = std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)((long)this + 0x158),(key_type *)(curr + 1));
      if (cVar7._M_node == (_Base_ptr)((long)this + 0x160)) {
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)((long)this + 0x158),(Name *)(curr + 1));
      }
      else {
        fixAfterChanges::Fixer::replace((Fixer *)this);
      }
    }
  }
  else if (IVar1 == NumExpressionIds) goto LAB_00136d95;
  IVar1 = curr->_id;
  if ((int)IVar1 < 0x31) {
    if (IVar1 != BreakId) {
      if (IVar1 != SwitchId) {
        if (IVar1 != InvalidId) {
          return;
        }
        goto LAB_00136d95;
      }
      uVar3 = curr[3].type.id;
      if (uVar3 != 0) {
        lVar9 = *(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3;
        uVar12 = lVar9 + *(long *)((long)this + 0xd8);
        if (uVar12 != 0) {
          uVar8 = ((int)lVar9 + (int)*(long *)((long)this + 0xd8)) - 1;
          do {
            lVar9 = *(long *)((long)this + 0x130) + -0x50;
            if (uVar8 < 10) {
              lVar9 = (long)this + 0xe0;
            }
            piVar4 = *(int **)(lVar9 + (ulong)uVar8 * 8);
            iVar2 = *piVar4;
            if (iVar2 < 3) {
              if (iVar2 != 1) {
                if (iVar2 == 2) goto LAB_0013699b;
                goto LAB_00136d76;
              }
              if (*(uintptr_t *)(piVar4 + 6) == uVar3) {
                uVar12 = 1;
                goto LAB_001369a8;
              }
LAB_001369a3:
              bVar5 = true;
            }
            else {
              if (iVar2 == 3) {
                if (*(uintptr_t *)(piVar4 + 6) != uVar3) goto LAB_0013699b;
                uVar12 = 1;
                bVar5 = false;
              }
              else {
                if (iVar2 != 0x31) goto LAB_00136d76;
LAB_0013699b:
                bVar5 = true;
              }
              if (bVar5) goto LAB_001369a3;
LAB_001369a8:
              bVar5 = false;
            }
            bVar6 = false;
            if (bVar5) {
              if (uVar8 == 0) {
                uVar8 = 0;
                uVar12 = 0;
              }
              else {
                uVar8 = uVar8 - 1;
                bVar6 = true;
              }
            }
          } while (bVar6);
          if ((uVar12 & 1) != 0) goto LAB_00136c6d;
        }
        fixAfterChanges::Fixer::replace((Fixer *)this);
      }
LAB_00136c6d:
      if (curr[1].type.id == 0) {
        return;
      }
      uVar12 = 0;
      do {
        lVar9 = *(long *)(*(long *)(curr + 1) + 8 + uVar12 * 0x10);
        if (lVar9 != 0) {
          uVar11 = *(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3;
          if (uVar11 + *(long *)((long)this + 0xd8) != 0) {
            uVar8 = ((int)*(long *)((long)this + 0xd8) + (int)uVar11) - 1;
            do {
              lVar10 = *(long *)((long)this + 0x130) + -0x50;
              if (uVar8 < 10) {
                lVar10 = (long)this + 0xe0;
              }
              piVar4 = *(int **)(lVar10 + (ulong)uVar8 * 8);
              iVar2 = *piVar4;
              if (iVar2 < 3) {
                if (iVar2 != 1) {
                  if (iVar2 == 2) goto LAB_00136d14;
                  goto LAB_00136d76;
                }
                if (*(long *)(piVar4 + 6) == lVar9) {
                  uVar11 = 1;
                  goto LAB_00136d21;
                }
LAB_00136d1c:
                bVar5 = true;
              }
              else {
                if (iVar2 == 3) {
                  if (*(long *)(piVar4 + 6) != lVar9) goto LAB_00136d14;
                  uVar11 = 1;
                  bVar5 = false;
                }
                else {
                  if (iVar2 != 0x31) goto LAB_00136d76;
LAB_00136d14:
                  bVar5 = true;
                }
                if (bVar5) goto LAB_00136d1c;
LAB_00136d21:
                bVar5 = false;
              }
              bVar6 = false;
              if (bVar5) {
                if (uVar8 == 0) {
                  uVar8 = 0;
                  uVar11 = 0;
                }
                else {
                  uVar8 = uVar8 - 1;
                  bVar6 = true;
                }
              }
            } while (bVar6);
            if ((uVar11 & 1) != 0) goto LAB_00136d56;
          }
          fixAfterChanges::Fixer::replace((Fixer *)this);
        }
LAB_00136d56:
        uVar12 = (ulong)((int)uVar12 + 1);
        if (curr[1].type.id <= uVar12) {
          return;
        }
      } while( true );
    }
    uVar3 = curr[1].type.id;
    if (uVar3 == 0) {
      return;
    }
    lVar9 = *(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3;
    uVar12 = lVar9 + *(long *)((long)this + 0xd8);
    if (uVar12 == 0) goto LAB_00136c42;
    uVar8 = ((int)lVar9 + (int)*(long *)((long)this + 0xd8)) - 1;
    do {
      lVar9 = *(long *)((long)this + 0x130) + -0x50;
      if (uVar8 < 10) {
        lVar9 = (long)this + 0xe0;
      }
      piVar4 = *(int **)(lVar9 + (ulong)uVar8 * 8);
      iVar2 = *piVar4;
      if (iVar2 < 3) {
        if (iVar2 != 1) {
          if (iVar2 == 2) goto LAB_00136b38;
          goto LAB_00136d76;
        }
        if (*(uintptr_t *)(piVar4 + 6) == uVar3) {
          uVar12 = 1;
          goto LAB_00136b45;
        }
LAB_00136b40:
        bVar5 = true;
      }
      else {
        if (iVar2 == 3) {
          if (*(uintptr_t *)(piVar4 + 6) != uVar3) goto LAB_00136b38;
          uVar12 = 1;
          bVar5 = false;
        }
        else {
          if (iVar2 != 0x31) goto LAB_00136d76;
LAB_00136b38:
          bVar5 = true;
        }
        if (bVar5) goto LAB_00136b40;
LAB_00136b45:
        bVar5 = false;
      }
      bVar6 = false;
      if (bVar5) {
        if (uVar8 == 0) {
          uVar8 = 0;
          uVar12 = 0;
        }
        else {
          uVar8 = uVar8 - 1;
          bVar6 = true;
        }
      }
    } while (bVar6);
  }
  else if ((int)IVar1 < 0x3b) {
    if (IVar1 == TryId) {
      lVar9 = *(long *)(curr + 7);
      if (lVar9 == 0) {
        return;
      }
      lVar10 = *(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3;
      uVar12 = lVar10 + *(long *)((long)this + 0xd8);
      if (uVar12 == 0) goto LAB_00136c42;
      uVar8 = ((int)lVar10 + (int)*(long *)((long)this + 0xd8)) - 1;
      do {
        lVar10 = *(long *)((long)this + 0x130) + -0x50;
        if (uVar8 < 10) {
          lVar10 = (long)this + 0xe0;
        }
        piVar4 = *(int **)(lVar10 + (ulong)uVar8 * 8);
        iVar2 = *piVar4;
        if (iVar2 < 3) {
          if (iVar2 != 1) {
            if (iVar2 == 2) goto LAB_00136c02;
            goto LAB_00136d76;
          }
          if (*(long *)(piVar4 + 6) == lVar9) {
            uVar12 = 1;
            goto LAB_00136c0f;
          }
LAB_00136c0a:
          bVar5 = true;
        }
        else {
          if (iVar2 == 3) {
            if (*(long *)(piVar4 + 6) != lVar9) goto LAB_00136c02;
            uVar12 = 1;
            bVar5 = false;
          }
          else {
            if (iVar2 != 0x31) goto LAB_00136d76;
LAB_00136c02:
            bVar5 = true;
          }
          if (bVar5) goto LAB_00136c0a;
LAB_00136c0f:
          bVar5 = false;
        }
        bVar6 = false;
        if (bVar5) {
          if (uVar8 == 0) {
            uVar8 = 0;
            uVar12 = 0;
          }
          else {
            uVar8 = uVar8 - 1;
            bVar6 = true;
          }
        }
      } while (bVar6);
    }
    else {
      if (IVar1 != RethrowId) {
        return;
      }
      uVar3 = curr[1].type.id;
      if (uVar3 == 0) {
        return;
      }
      lVar9 = *(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3;
      uVar12 = lVar9 + *(long *)((long)this + 0xd8);
      if (uVar12 == 0) goto LAB_00136c42;
      uVar8 = ((int)lVar9 + (int)*(long *)((long)this + 0xd8)) - 1;
      do {
        lVar9 = *(long *)((long)this + 0x130) + -0x50;
        if (uVar8 < 10) {
          lVar9 = (long)this + 0xe0;
        }
        piVar4 = *(int **)(lVar9 + (ulong)uVar8 * 8);
        iVar2 = *piVar4;
        if (iVar2 < 3) {
          if (iVar2 != 1) {
            if (iVar2 == 2) goto LAB_001368bf;
            goto LAB_00136d76;
          }
          if (*(uintptr_t *)(piVar4 + 6) == uVar3) {
            uVar12 = 1;
            goto LAB_001368cc;
          }
LAB_001368c7:
          bVar5 = true;
        }
        else {
          if (iVar2 == 3) {
            if (*(uintptr_t *)(piVar4 + 6) != uVar3) goto LAB_001368bf;
            uVar12 = 1;
            bVar5 = false;
          }
          else {
            if (iVar2 != 0x31) {
LAB_00136d76:
              __assert_fail("curr->is<If>() || curr->is<Try>()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                            ,0x399,
                            "bool wasm::TranslateToFuzzReader::fixAfterChanges(Function *)::Fixer::hasBreakTarget(Name)"
                           );
            }
LAB_001368bf:
            bVar5 = true;
          }
          if (bVar5) goto LAB_001368c7;
LAB_001368cc:
          bVar5 = false;
        }
        bVar6 = false;
        if (bVar5) {
          if (uVar8 == 0) {
            uVar8 = 0;
            uVar12 = 0;
          }
          else {
            uVar8 = uVar8 - 1;
            bVar6 = true;
          }
        }
      } while (bVar6);
    }
  }
  else {
    if (IVar1 != BrOnId) {
      if (IVar1 != NumExpressionIds) {
        return;
      }
LAB_00136d95:
      wasm::handle_unreachable
                ("unexpected expression type",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                 ,0xb0);
    }
    lVar9 = *(long *)(curr + 2);
    if (lVar9 == 0) {
      return;
    }
    lVar10 = *(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3;
    uVar12 = lVar10 + *(long *)((long)this + 0xd8);
    if (uVar12 == 0) goto LAB_00136c42;
    uVar8 = ((int)lVar10 + (int)*(long *)((long)this + 0xd8)) - 1;
    do {
      lVar10 = *(long *)((long)this + 0x130) + -0x50;
      if (uVar8 < 10) {
        lVar10 = (long)this + 0xe0;
      }
      piVar4 = *(int **)(lVar10 + (ulong)uVar8 * 8);
      iVar2 = *piVar4;
      if (iVar2 < 3) {
        if (iVar2 != 1) {
          if (iVar2 == 2) goto LAB_00136a6e;
          goto LAB_00136d76;
        }
        if (*(long *)(piVar4 + 6) == lVar9) {
          uVar12 = 1;
          goto LAB_00136a7b;
        }
LAB_00136a76:
        bVar5 = true;
      }
      else {
        if (iVar2 == 3) {
          if (*(long *)(piVar4 + 6) != lVar9) goto LAB_00136a6e;
          uVar12 = 1;
          bVar5 = false;
        }
        else {
          if (iVar2 != 0x31) goto LAB_00136d76;
LAB_00136a6e:
          bVar5 = true;
        }
        if (bVar5) goto LAB_00136a76;
LAB_00136a7b:
        bVar5 = false;
      }
      bVar6 = false;
      if (bVar5) {
        if (uVar8 == 0) {
          uVar8 = 0;
          uVar12 = 0;
        }
        else {
          uVar8 = uVar8 - 1;
          bVar6 = true;
        }
      }
    } while (bVar6);
  }
  if ((uVar12 & 1) != 0) {
    return;
  }
LAB_00136c42:
  fixAfterChanges::Fixer::replace((Fixer *)this);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      // Note all scope names, and fix up all uses.
      BranchUtils::operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name.is()) {
          if (seen.count(name)) {
            replace();
          } else {
            seen.insert(name);
          }
        }
      });
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          replaceIfInvalid(name);
        }
      });
    }